

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O3

string * __thiscall pbrt::Sphere::ToString_abi_cxx11_(string *__return_storage_ptr__,Sphere *this)

{
  Transform *v;
  Transform *args;
  
  v = this->renderFromObject;
  args = this->objectFromRender;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Transform_const&,pbrt::Transform_const&,bool_const&,bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
            (__return_storage_ptr__,
             "[ Sphere renderFromObject: %s objectFromRender: %s reverseOrientation: %s transformSwapsHandedness: %s radius: %f zMin: %f zMax: %f thetaMin: %f thetaMax: %f phiMax: %f ]"
             ,v,args,&this->reverseOrientation,&this->transformSwapsHandedness,&this->radius,
             &this->zMin,&this->zMax,&this->thetaZMin,&this->thetaZMax,&this->phiMax);
  return __return_storage_ptr__;
}

Assistant:

std::string Sphere::ToString() const {
    return StringPrintf("[ Sphere renderFromObject: %s "
                        "objectFromRender: %s reverseOrientation: %s "
                        "transformSwapsHandedness: %s radius: %f zMin: %f "
                        "zMax: %f thetaMin: %f "
                        "thetaMax: %f phiMax: %f ]",
                        *renderFromObject, *objectFromRender, reverseOrientation,
                        transformSwapsHandedness, radius, zMin, zMax, thetaZMin,
                        thetaZMax, phiMax);
}